

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionShape.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionShapeCircular::UpdateProfile(ChBeamSectionShapeCircular *this)

{
  pointer pCVar1;
  double __x;
  undefined1 auVar2 [16];
  long lVar3;
  size_t is;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (&this->points,(long)this->resolution + 1);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (&this->normals,(long)this->resolution + 1);
  lVar3 = 0x10;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(this->points).
                             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->points).
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1) {
    auVar2._8_8_ = in_XMM2_Qb;
    auVar2._0_8_ = in_XMM2_Qa;
    auVar2 = vcvtusi2sd_avx512f(auVar2,uVar4);
    __x = (auVar2._0_8_ / (double)this->resolution) * 6.283185307179586;
    dVar5 = cos(__x);
    dVar7 = this->radius;
    dVar6 = sin(__x);
    dVar8 = this->radius;
    pCVar1 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)pCVar1->m_data + lVar3 + -0x10) = 0;
    *(double *)((long)pCVar1->m_data + lVar3 + -8) = dVar5 * dVar7;
    *(double *)((long)pCVar1->m_data + lVar3) = dVar6 * dVar8;
    dVar7 = cos(__x);
    dVar8 = sin(__x);
    pCVar1 = (this->normals).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)pCVar1->m_data + lVar3 + -0x10) = 0;
    *(double *)((long)pCVar1->m_data + lVar3 + -8) = dVar7;
    *(double *)((long)pCVar1->m_data + lVar3) = dVar8;
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

void ChBeamSectionShapeCircular::UpdateProfile() {
    points.resize(resolution + 1);
    normals.resize(resolution + 1);
    for (size_t is = 0; is < points.size(); ++is) {
        double sangle = CH_C_2PI * ((double)is / (double)resolution);
        points[is] = ChVector<>(0, cos(sangle) * radius, sin(sangle) * radius);
        normals[is] = ChVector<>(0, cos(sangle), sin(sangle));
    }
}